

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

INTERNAL_DECODER_DATA *
internal_decoder_create
          (ON_VALUE_DECODED on_value_decoded,void *callback_context,AMQP_VALUE_DATA *value_data,
          _Bool is_internal)

{
  INTERNAL_DECODER_DATA *pIVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  INTERNAL_DECODER_DATA *internal_decoder_data;
  _Bool is_internal_local;
  AMQP_VALUE_DATA *value_data_local;
  void *callback_context_local;
  ON_VALUE_DECODED on_value_decoded_local;
  
  pIVar1 = (INTERNAL_DECODER_DATA *)calloc(1,0x40);
  if (pIVar1 == (INTERNAL_DECODER_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"internal_decoder_create",0x1324,1,
                "Cannot allocate memory for internal decoder structure");
    }
  }
  else {
    pIVar1->is_internal = is_internal;
    pIVar1->on_value_decoded = on_value_decoded;
    pIVar1->on_value_decoded_context = callback_context;
    pIVar1->decoder_state = DECODER_STATE_CONSTRUCTOR;
    pIVar1->inner_decoder = (INTERNAL_DECODER_HANDLE)0x0;
    pIVar1->decode_to_value = value_data;
  }
  return pIVar1;
}

Assistant:

static INTERNAL_DECODER_DATA* internal_decoder_create(ON_VALUE_DECODED on_value_decoded, void* callback_context, AMQP_VALUE_DATA* value_data, bool is_internal)
{
    INTERNAL_DECODER_DATA* internal_decoder_data = (INTERNAL_DECODER_DATA*)calloc(1, sizeof(INTERNAL_DECODER_DATA));
    if (internal_decoder_data == NULL)
    {
        LogError("Cannot allocate memory for internal decoder structure");
    }
    else
    {
        internal_decoder_data->is_internal = is_internal;
        internal_decoder_data->on_value_decoded = on_value_decoded;
        internal_decoder_data->on_value_decoded_context = callback_context;
        internal_decoder_data->decoder_state = DECODER_STATE_CONSTRUCTOR;
        internal_decoder_data->inner_decoder = NULL;
        internal_decoder_data->decode_to_value = value_data;
    }

    return internal_decoder_data;
}